

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O0

void __thiscall indigox::ElectronOpt::ElectronOpt(ElectronOpt *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::vector
            ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
             0x12be97);
  std::make_shared<indigox::MolecularGraph>();
  std::make_shared<indigox::ElectronGraph>();
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)0x12beca);
  std::shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm>::shared_ptr
            ((shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm> *)0x12bed8);
  return;
}

Assistant:

ElectronOpt::ElectronOpt()
: electronsToAdd_(0), molGraph_(std::make_shared<MolecularGraph>()),
elnGraph_(std::make_shared<ElectronGraph>()) { }